

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetHelp(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmNinjaRule rule;
  allocator<char> local_1c9;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  string local_168;
  undefined1 local_148 [64];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_108 [32];
  char local_e8 [200];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"HELP",(allocator<char> *)&local_1a8);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  NinjaCmd_abi_cxx11_(&local_1c8,this);
  std::operator+(&local_1a8,&local_1c8," -t targets");
  std::__cxx11::string::operator=((string *)(local_148 + 0x20),(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::assign((char *)local_108);
  std::__cxx11::string::assign(local_e8);
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_148);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"HELP",(allocator<char> *)&local_1a8);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_148,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::assign((char *)local_148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"help",&local_1c9);
  NinjaOutputPath(&local_1a8,this,&local_1c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_108,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  WriteBuild(this,os,(cmNinjaBuild *)local_148,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_148);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetHelp(std::ostream& os)
{
  {
    cmNinjaRule rule("HELP");
    rule.Command = NinjaCmd() + " -t targets";
    rule.Description = "All primary targets available:";
    rule.Comment = "Rule for printing all primary targets available.";
    WriteRule(*this->RulesFileStream, rule);
  }
  {
    cmNinjaBuild build("HELP");
    build.Comment = "Print all primary targets available.";
    build.Outputs.push_back(this->NinjaOutputPath("help"));
    WriteBuild(os, build);
  }
}